

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O0

void __thiscall
QAbstractSpinBoxPrivate::updateState(QAbstractSpinBoxPrivate *this,bool up,bool fromKeyboard)

{
  Int IVar1;
  Int IVar2;
  QAbstractSpinBox *pQVar3;
  byte bVar4;
  uint uVar5;
  byte in_DL;
  uint uVar6;
  byte in_SIL;
  QAbstractSpinBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  int steps;
  QAbstractSpinBox *q;
  QAccessibleValueChangeEvent event;
  undefined4 in_stack_ffffffffffffff48;
  StepEnabledFlag in_stack_ffffffffffffff4c;
  QAbstractSpinBoxPrivate *in_stack_ffffffffffffff50;
  int *val;
  Duration duration;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 uVar7;
  int local_8c;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_54;
  undefined4 local_50;
  QFlagsStorageHelper<QAbstractSpinBox::StepEnabledFlag,_4> local_4c;
  QAccessibleValueChangeEvent local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = in_SIL & 1;
  pQVar3 = q_func(in_RDI);
  if (((bVar4 == 0) || ((in_RDI->buttonState & 0x10) == 0)) &&
     ((bVar4 != 0 || ((in_RDI->buttonState & 0x20) == 0)))) {
    reset(in_stack_ffffffffffffff50);
    uVar7 = false;
    if (pQVar3 != (QAbstractSpinBox *)0x0) {
      local_50 = (**(code **)(*(long *)&pQVar3->super_QWidget + 0x1c8))();
      local_4c.super_QFlagsStorage<QAbstractSpinBox::StepEnabledFlag>.i =
           (QFlagsStorage<QAbstractSpinBox::StepEnabledFlag>)
           QFlags<QAbstractSpinBox::StepEnabledFlag>::operator&
                     ((QFlags<QAbstractSpinBox::StepEnabledFlag> *)in_stack_ffffffffffffff50,
                      in_stack_ffffffffffffff4c);
      IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_4c);
      uVar7 = IVar1 != 0;
    }
    if ((bool)uVar7 != false) {
      uVar5 = 0x20;
      if (bVar4 != 0) {
        uVar5 = 0x10;
      }
      uVar6 = 2;
      if ((in_DL & 1) != 0) {
        uVar6 = 1;
      }
      in_RDI->buttonState = uVar5 | uVar6;
      local_8c = -1;
      if (bVar4 != 0) {
        local_8c = 1;
      }
      local_54.super_QFlagsStorage<Qt::KeyboardModifier>.i =
           (QFlagsStorage<Qt::KeyboardModifier>)
           QFlags<Qt::KeyboardModifier>::operator&
                     ((QFlags<Qt::KeyboardModifier> *)in_stack_ffffffffffffff50,
                      in_stack_ffffffffffffff4c);
      IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_54);
      if (IVar2 != 0) {
        local_8c = local_8c * 10;
      }
      (**(code **)(*(long *)&pQVar3->super_QWidget + 0x1b0))(pQVar3,local_8c);
      duration.__r = (rep)&in_RDI->spinClickThresholdTimer;
      val = &in_RDI->spinClickThresholdTimerInterval;
      ms<(char)49>();
      std::chrono::operator*
                ((int *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                 (duration<long,_std::ratio<1L,_1000L>_> *)0x68905b);
      std::chrono::duration<long,std::ratio<1l,1000000000l>>::
      duration<long,std::ratio<1l,1000l>,void>
                ((duration<long,_std::ratio<1L,_1000000000L>_> *)val,
                 (duration<long,_std::ratio<1L,_1000L>_> *)
                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      QBasicTimer::start((QBasicTimer *)
                         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),duration,
                         (QObject *)0x689083);
      memset(local_48,0xaa,0x40);
      QAccessibleValueChangeEvent::QAccessibleValueChangeEvent
                ((QAccessibleValueChangeEvent *)CONCAT17(uVar7,in_stack_ffffffffffffff60),
                 (QObject *)duration.__r,(QVariant *)val);
      QAccessible::updateAccessibility((QAccessibleEvent *)local_48);
      QAccessibleValueChangeEvent::~QAccessibleValueChangeEvent(local_48);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractSpinBoxPrivate::updateState(bool up, bool fromKeyboard /* = false */)
{
    Q_Q(QAbstractSpinBox);
    if ((up && (buttonState & Up)) || (!up && (buttonState & Down)))
        return;
    reset();
    if (q && (q->stepEnabled() & (up ? QAbstractSpinBox::StepUpEnabled
                                  : QAbstractSpinBox::StepDownEnabled))) {
        buttonState = (up ? Up : Down) | (fromKeyboard ? Keyboard : Mouse);
        int steps = up ? 1 : -1;
        if (keyboardModifiers & stepModifier)
            steps *= 10;
        q->stepBy(steps);
        spinClickThresholdTimer.start(spinClickThresholdTimerInterval * 1ms, q);
#if QT_CONFIG(accessibility)
        QAccessibleValueChangeEvent event(q, value);
        QAccessible::updateAccessibility(&event);
#endif
    }
}